

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

bool DeploymentEnabled<Consensus::BuriedDeployment>
               (ChainstateManager *chainman,BuriedDeployment dep)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    bVar1 = DeploymentEnabled(&((chainman->m_options).chainparams)->consensus,dep);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DeploymentEnabled(const ChainstateManager& chainman, DEP dep)
{
    return DeploymentEnabled(chainman.GetConsensus(), dep);
}